

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O1

string * __thiscall
TargetPropertyNode::Evaluate
          (string *__return_storage_ptr__,TargetPropertyNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *dagCheckerParent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  Result RVar6;
  PolicyStatus PVar7;
  TargetType TVar8;
  cmGeneratorTarget *pcVar9;
  string *psVar10;
  ostream *poVar11;
  char *pcVar12;
  cmLinkInterfaceLibraries *libraries;
  cmLinkImplementationLibraries *libraries_00;
  size_t sVar13;
  long lVar14;
  char *pcVar15;
  cmGeneratorTarget *head;
  cmGeneratorTarget *target;
  string linkedTargetsContent;
  string propertyName;
  string interfacePropertyName;
  cmGeneratorExpressionDAGChecker dagChecker;
  cmGeneratorTarget *local_268;
  string local_260;
  string local_240;
  cmGeneratorExpressionDAGChecker *local_220;
  string local_218;
  string local_1f8;
  cmListFileBacktrace local_1d8;
  string local_1c8;
  undefined1 local_1a8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  _Rb_tree<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_178;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_138;
  
  if (1 < ((long)(parameters->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(parameters->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)local_1a8,content);
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_240,
               "$<TARGET_PROPERTY:...> expression requires one or two parameters","");
    reportError(context,(string *)local_1a8,&local_240);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  if ((Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
       ::propertyNameValidator == '\0') &&
     (iVar5 = __cxa_guard_acquire(&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                                   ::propertyNameValidator), iVar5 != 0)) {
    Evaluate::propertyNameValidator.regmatch.startp[0] = (char *)0x0;
    Evaluate::propertyNameValidator.regmatch.endp[0] = (char *)0x0;
    Evaluate::propertyNameValidator.regmatch.searchstring = (char *)0x0;
    Evaluate::propertyNameValidator.program = (char *)0x0;
    cmsys::RegularExpression::compile(&Evaluate::propertyNameValidator,"^[A-Za-z0-9_]+$");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&Evaluate::propertyNameValidator,
                 &__dso_handle);
    __cxa_guard_release(&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                         ::propertyNameValidator);
  }
  local_268 = context->HeadTarget;
  pbVar2 = (parameters->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
  pcVar3 = (pbVar2->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_240,pcVar3,pcVar3 + pbVar2->_M_string_length);
  pbVar2 = (parameters->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar14 = (long)(parameters->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2;
  if ((lVar14 == 0x20) &&
     (context->HadHeadSensitiveCondition = true, local_268 == (cmGeneratorTarget *)0x0)) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)local_1a8,content);
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,
               "$<TARGET_PROPERTY:prop>  may only be used with binary targets.  It may not be used with add_custom_command or add_custom_target.  Specify the target to read a property from using the $<TARGET_PROPERTY:tgt,prop> signature instead."
               ,"");
    reportError(context,(string *)local_1a8,&local_260);
    goto LAB_003231cf;
  }
  if (lVar14 == 0x40) {
    if (pbVar2->_M_string_length == 0) {
      if (pbVar2[1]._M_string_length == 0) {
        GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)local_1a8,content);
        local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_260,
                   "$<TARGET_PROPERTY:tgt,prop> expression requires a non-empty target name and property name."
                   ,"");
        reportError(context,(string *)local_1a8,&local_260);
      }
      else {
        GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)local_1a8,content);
        local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_260,
                   "$<TARGET_PROPERTY:tgt,prop> expression requires a non-empty target name.","");
        reportError(context,(string *)local_1a8,&local_260);
      }
      goto LAB_003231cf;
    }
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    pcVar3 = (pbVar2->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_260,pcVar3,pcVar3 + pbVar2->_M_string_length);
    std::__cxx11::string::_M_assign((string *)&local_240);
    bVar4 = cmGeneratorExpression::IsValidTargetName(&local_260);
    if (bVar4) {
      if ((Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
           ::propALIASED_TARGET_abi_cxx11_ == '\0') &&
         (iVar5 = __cxa_guard_acquire(&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                                       ::propALIASED_TARGET_abi_cxx11_), iVar5 != 0)) {
        Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
        ::propALIASED_TARGET_abi_cxx11_._M_dataplus._M_p =
             (pointer)&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                       ::propALIASED_TARGET_abi_cxx11_.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)
                   &Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                    ::propALIASED_TARGET_abi_cxx11_,"ALIASED_TARGET","");
        __cxa_atexit(std::__cxx11::string::~string,
                     &Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                      ::propALIASED_TARGET_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                             ::propALIASED_TARGET_abi_cxx11_);
      }
      if ((local_240._M_string_length ==
           Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
           ::propALIASED_TARGET_abi_cxx11_._M_string_length) &&
         ((local_240._M_string_length == 0 ||
          (iVar5 = bcmp(local_240._M_dataplus._M_p,
                        Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                        ::propALIASED_TARGET_abi_cxx11_._M_dataplus._M_p,local_240._M_string_length)
          , iVar5 == 0)))) {
        bVar4 = cmMakefile::IsAlias(context->LG->Makefile,&local_260);
        if ((bVar4) &&
           (pcVar9 = cmLocalGenerator::FindGeneratorTargetToUse(context->LG,&local_260),
           pcVar9 != (cmGeneratorTarget *)0x0)) {
          psVar10 = cmGeneratorTarget::GetName_abi_cxx11_(pcVar9);
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar3 = (psVar10->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)__return_storage_ptr__,pcVar3,pcVar3 + psVar10->_M_string_length);
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
        }
      }
      else {
        local_268 = cmLocalGenerator::FindGeneratorTargetToUse(context->LG,&local_260);
        if (local_268 != (cmGeneratorTarget *)0x0) {
          std::
          _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
          ::_M_insert_unique<cmGeneratorTarget_const*const&>
                    ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                      *)&context->AllTargets,&local_268);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_260._M_dataplus._M_p != &local_260.field_2) {
            operator_delete(local_260._M_dataplus._M_p,
                            CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                                     local_260.field_2._M_local_buf[0]) + 1);
          }
          goto LAB_003233c4;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Target \"",8);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,local_260._M_dataplus._M_p,
                             local_260._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\" not found.",0xc);
        GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_218,content);
        std::__cxx11::stringbuf::str();
        reportError(context,&local_218,&local_1f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p,
                          CONCAT71(local_218.field_2._M_allocated_capacity._1_7_,
                                   local_218.field_2._M_local_buf[0]) + 1);
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        __return_storage_ptr__->_M_string_length = 0;
        (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base((ios_base *)&local_138);
      }
    }
    else {
      bVar4 = cmsys::RegularExpression::find
                        (&Evaluate::propertyNameValidator,local_240._M_dataplus._M_p,
                         &Evaluate::propertyNameValidator.regmatch);
      if (bVar4) {
        GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)local_1a8,content);
        local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_218,"Target name not supported.","");
        reportError(context,(string *)local_1a8,&local_218);
      }
      else {
        GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)local_1a8,content);
        local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_218,"Target name and property name not supported.","");
        reportError(context,(string *)local_1a8,&local_218);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,
                        CONCAT71(local_218.field_2._M_allocated_capacity._1_7_,
                                 local_218.field_2._M_local_buf[0]) + 1);
      }
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p == &local_260.field_2) goto LAB_0032321f;
    local_188._M_allocated_capacity =
         CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,local_260.field_2._M_local_buf[0]);
    local_1a8._16_8_ = local_260._M_dataplus._M_p;
LAB_00324452:
    operator_delete((void *)local_1a8._16_8_,local_188._M_allocated_capacity + 1);
  }
  else {
LAB_003233c4:
    if (local_268 == context->HeadTarget) {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&context->SeenTargetProperties,&local_240);
    }
    iVar5 = std::__cxx11::string::compare((char *)&local_240);
    if (iVar5 == 0) {
      std::
      _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
      ::_M_insert_unique<cmGeneratorTarget_const*const&>
                ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                  *)&context->SourceSensitiveTargets,&local_268);
    }
    if (local_240._M_string_length == 0) {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)local_1a8,content);
      local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_260,
                 "$<TARGET_PROPERTY:...> expression requires a non-empty property name.","");
      reportError(context,(string *)local_1a8,&local_260);
    }
    else {
      bVar4 = cmsys::RegularExpression::find
                        (&Evaluate::propertyNameValidator,local_240._M_dataplus._M_p,
                         &Evaluate::propertyNameValidator.regmatch);
      if (bVar4) {
        if (local_268 == (cmGeneratorTarget *)0x0) {
          __assert_fail("target",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmGeneratorExpressionNode.cxx"
                        ,0x516,
                        "virtual std::string TargetPropertyNode::Evaluate(const std::vector<std::string> &, cmGeneratorExpressionContext *, const GeneratorExpressionContent *, cmGeneratorExpressionDAGChecker *) const"
                       );
        }
        iVar5 = std::__cxx11::string::compare((char *)&local_240);
        pcVar9 = local_268;
        if (iVar5 != 0) {
          local_1d8.TopEntry.
          super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (context->Backtrace).TopEntry.
               super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
          local_1d8.TopEntry.
          super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (context->Backtrace).TopEntry.
               super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
          if (local_1d8.TopEntry.
              super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_1d8.TopEntry.
               super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_1d8.TopEntry.
                    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_1d8.TopEntry.
               super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_1d8.TopEntry.
                    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          local_220 = dagCheckerParent;
          local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1c8,local_240._M_dataplus._M_p,
                     local_240._M_dataplus._M_p + local_240._M_string_length);
          cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
                    ((cmGeneratorExpressionDAGChecker *)local_1a8,&local_1d8,pcVar9,&local_1c8,
                     content,local_220);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
          }
          if (local_1d8.TopEntry.
              super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_1d8.TopEntry.
                       super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          RVar6 = cmGeneratorExpressionDAGChecker::Check
                            ((cmGeneratorExpressionDAGChecker *)local_1a8);
          if (RVar6 == SELF_REFERENCE) {
            GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_260,content);
            cmGeneratorExpressionDAGChecker::ReportError
                      ((cmGeneratorExpressionDAGChecker *)local_1a8,context,&local_260);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260._M_dataplus._M_p != &local_260.field_2) {
LAB_00323cbf:
              operator_delete(local_260._M_dataplus._M_p,
                              CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                                       local_260.field_2._M_local_buf[0]) + 1);
            }
LAB_00323ccc:
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            __return_storage_ptr__->_M_string_length = 0;
            (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
          }
          else {
            if (RVar6 == CYCLIC_REFERENCE) goto LAB_00323ccc;
            if (RVar6 == ALREADY_SEEN) {
              lVar14 = 1;
              do {
                iVar5 = std::__cxx11::string::compare((char *)&local_240);
                if (iVar5 == 0) goto LAB_00323f16;
                lVar14 = lVar14 + 1;
              } while (lVar14 != 0xb);
            }
            pcVar12 = cmGeneratorTarget::GetProperty(local_268,&local_240);
            if (((local_220 == (cmGeneratorExpressionDAGChecker *)0x0) ||
                (bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingGenexExpression(local_220),
                bVar4)) ||
               (bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingPICExpression(local_220), bVar4))
            {
LAB_00323a0f:
              local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
              local_260._M_string_length = 0;
              local_260.field_2._M_local_buf[0] = '\0';
              local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
              local_218._M_string_length = 0;
              local_218.field_2._M_local_buf[0] = '\0';
              iVar5 = std::__cxx11::string::compare((char *)&local_240);
              if (iVar5 == 0) {
                pcVar15 = "INTERFACE_INCLUDE_DIRECTORIES";
LAB_003240cb:
                std::__cxx11::string::operator=((string *)&local_218,pcVar15);
LAB_003240d5:
                bVar4 = false;
              }
              else {
                pcVar15 = "INTERFACE_INCLUDE_DIRECTORIES";
                iVar5 = std::__cxx11::string::compare((char *)&local_240);
                if (iVar5 != 0) {
                  iVar5 = std::__cxx11::string::compare((char *)&local_240);
                  if (iVar5 == 0) {
                    pcVar15 = "INTERFACE_SYSTEM_INCLUDE_DIRECTORIES";
                    goto LAB_003240cb;
                  }
                  pcVar15 = "INTERFACE_SYSTEM_INCLUDE_DIRECTORIES";
                  iVar5 = std::__cxx11::string::compare((char *)&local_240);
                  if (iVar5 == 0) goto LAB_00323ce4;
                  iVar5 = std::__cxx11::string::compare((char *)&local_240);
                  if (iVar5 == 0) {
                    pcVar15 = "INTERFACE_COMPILE_DEFINITIONS";
                    goto LAB_003240cb;
                  }
                  pcVar15 = "INTERFACE_COMPILE_DEFINITIONS";
                  iVar5 = std::__cxx11::string::compare((char *)&local_240);
                  if (iVar5 == 0) goto LAB_00323ce4;
                  iVar5 = std::__cxx11::string::compare((char *)&local_240);
                  if (iVar5 == 0) {
                    pcVar15 = "INTERFACE_COMPILE_OPTIONS";
                    goto LAB_003240cb;
                  }
                  pcVar15 = "INTERFACE_COMPILE_OPTIONS";
                  iVar5 = std::__cxx11::string::compare((char *)&local_240);
                  if (iVar5 == 0) goto LAB_00323ce4;
                  iVar5 = std::__cxx11::string::compare((char *)&local_240);
                  if (iVar5 == 0) {
                    pcVar15 = "INTERFACE_AUTOUIC_OPTIONS";
                    goto LAB_003240cb;
                  }
                  pcVar15 = "INTERFACE_AUTOUIC_OPTIONS";
                  iVar5 = std::__cxx11::string::compare((char *)&local_240);
                  if (iVar5 == 0) goto LAB_00323ce4;
                  iVar5 = std::__cxx11::string::compare((char *)&local_240);
                  if (iVar5 == 0) {
                    pcVar15 = "INTERFACE_SOURCES";
                    goto LAB_003240cb;
                  }
                  pcVar15 = "INTERFACE_SOURCES";
                  iVar5 = std::__cxx11::string::compare((char *)&local_240);
                  if (iVar5 == 0) goto LAB_00323ce4;
                  iVar5 = std::__cxx11::string::compare((char *)&local_240);
                  if (iVar5 == 0) {
                    pcVar15 = "INTERFACE_COMPILE_FEATURES";
                    goto LAB_003240cb;
                  }
                  pcVar15 = "INTERFACE_COMPILE_FEATURES";
                  iVar5 = std::__cxx11::string::compare((char *)&local_240);
                  if (iVar5 == 0) goto LAB_00323ce4;
                  iVar5 = std::__cxx11::string::compare((char *)&local_240);
                  if (iVar5 == 0) {
                    pcVar15 = "INTERFACE_LINK_OPTIONS";
                    goto LAB_003240cb;
                  }
                  pcVar15 = "INTERFACE_LINK_OPTIONS";
                  iVar5 = std::__cxx11::string::compare((char *)&local_240);
                  if (iVar5 == 0) goto LAB_00323ce4;
                  iVar5 = std::__cxx11::string::compare((char *)&local_240);
                  if (iVar5 == 0) {
                    pcVar15 = "INTERFACE_LINK_DIRECTORIES";
                    goto LAB_003240cb;
                  }
                  pcVar15 = "INTERFACE_LINK_DIRECTORIES";
                  iVar5 = std::__cxx11::string::compare((char *)&local_240);
                  if (iVar5 == 0) goto LAB_00323ce4;
                  iVar5 = std::__cxx11::string::compare((char *)&local_240);
                  if (iVar5 == 0) {
                    pcVar15 = "INTERFACE_LINK_DEPENDS";
                    goto LAB_003240cb;
                  }
                  pcVar15 = "INTERFACE_LINK_DEPENDS";
                  iVar5 = std::__cxx11::string::compare((char *)&local_240);
                  if (iVar5 == 0) goto LAB_00323ce4;
                  iVar5 = strncmp(local_240._M_dataplus._M_p,"COMPILE_DEFINITIONS_",0x14);
                  if ((iVar5 == 0) &&
                     (PVar7 = cmLocalGenerator::GetPolicyStatus(context->LG,CMP0043), PVar7 < NEW))
                  {
                    std::__cxx11::string::operator=
                              ((string *)&local_218,"INTERFACE_COMPILE_DEFINITIONS");
                  }
                  goto LAB_003240d5;
                }
LAB_00323ce4:
                bVar4 = true;
                std::__cxx11::string::operator=((string *)&local_218,pcVar15);
              }
              pcVar9 = local_268;
              head = context->HeadTarget;
              if (context->HeadTarget == (cmGeneratorTarget *)0x0) {
                head = local_268;
              }
              if (bVar4) {
                libraries = cmGeneratorTarget::GetLinkInterfaceLibraries
                                      (local_268,&context->Config,head,true);
                pcVar9 = head;
                if (libraries != (cmLinkInterfaceLibraries *)0x0) {
                  getLinkedTargetsContent<cmLinkItem>
                            (&local_1f8,&libraries->Libraries,local_268,head,context,
                             (cmGeneratorExpressionDAGChecker *)local_1a8,&local_218);
LAB_00324184:
                  std::__cxx11::string::operator=((string *)&local_260,(string *)&local_1f8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                    operator_delete(local_1f8._M_dataplus._M_p,
                                    local_1f8.field_2._M_allocated_capacity + 1);
                  }
                }
              }
              else if ((local_218._M_string_length != 0) &&
                      (libraries_00 = cmGeneratorTarget::GetLinkImplementationLibraries
                                                (local_268,&context->Config),
                      libraries_00 != (cmLinkImplementationLibraries *)0x0)) {
                getLinkedTargetsContent<cmLinkImplItem>
                          (&local_1f8,&libraries_00->Libraries,local_268,local_268,context,
                           (cmGeneratorExpressionDAGChecker *)local_1a8,&local_218);
                goto LAB_00324184;
              }
              if (pcVar12 == (char *)0x0) {
                bVar4 = cmGeneratorTarget::IsImported(local_268);
                if ((bVar4) ||
                   (TVar8 = cmGeneratorTarget::GetType(local_268), TVar8 == INTERFACE_LIBRARY)) {
                  (__return_storage_ptr__->_M_dataplus)._M_p =
                       (pointer)&__return_storage_ptr__->field_2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_260._M_dataplus._M_p == &local_260.field_2) {
                    (__return_storage_ptr__->field_2)._M_allocated_capacity =
                         CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                                  local_260.field_2._M_local_buf[0]);
                    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) =
                         local_260.field_2._8_8_;
                  }
                  else {
                    (__return_storage_ptr__->_M_dataplus)._M_p = local_260._M_dataplus._M_p;
                    (__return_storage_ptr__->field_2)._M_allocated_capacity =
                         CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                                  local_260.field_2._M_local_buf[0]);
                  }
                  __return_storage_ptr__->_M_string_length = local_260._M_string_length;
LAB_003243c8:
                  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
                  local_260._M_string_length = 0;
                  local_260.field_2._M_local_buf[0] = '\0';
                }
                else {
                  psVar10 = &context->Config;
                  bVar4 = cmGeneratorTarget::IsLinkInterfaceDependentBoolProperty
                                    (local_268,&local_240,psVar10);
                  if (bVar4) {
                    context->HadContextSensitiveCondition = true;
                    bVar4 = cmGeneratorTarget::GetLinkInterfaceDependentBoolProperty
                                      (local_268,&local_240,psVar10);
                    pcVar12 = "0";
                    if (bVar4) {
                      pcVar12 = "1";
                    }
                    (__return_storage_ptr__->_M_dataplus)._M_p =
                         (pointer)&__return_storage_ptr__->field_2;
                    pcVar15 = "";
                    if (bVar4) {
                      pcVar15 = "";
                    }
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)__return_storage_ptr__,pcVar12,pcVar15);
                  }
                  else {
                    bVar4 = cmGeneratorTarget::IsLinkInterfaceDependentStringProperty
                                      (local_268,&local_240,psVar10);
                    if (bVar4) {
                      context->HadContextSensitiveCondition = true;
                      pcVar15 = cmGeneratorTarget::GetLinkInterfaceDependentStringProperty
                                          (local_268,&local_240,psVar10);
                      pcVar12 = "";
                      if (pcVar15 != (char *)0x0) {
                        pcVar12 = pcVar15;
                      }
                      (__return_storage_ptr__->_M_dataplus)._M_p =
                           (pointer)&__return_storage_ptr__->field_2;
                      sVar13 = strlen(pcVar12);
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)__return_storage_ptr__,pcVar12,pcVar12 + sVar13);
                    }
                    else {
                      bVar4 = cmGeneratorTarget::IsLinkInterfaceDependentNumberMinProperty
                                        (local_268,&local_240,psVar10);
                      if (bVar4) {
                        context->HadContextSensitiveCondition = true;
                        pcVar15 = cmGeneratorTarget::GetLinkInterfaceDependentNumberMinProperty
                                            (local_268,&local_240,psVar10);
                        pcVar12 = "";
                        if (pcVar15 != (char *)0x0) {
                          pcVar12 = pcVar15;
                        }
                        (__return_storage_ptr__->_M_dataplus)._M_p =
                             (pointer)&__return_storage_ptr__->field_2;
                        sVar13 = strlen(pcVar12);
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)__return_storage_ptr__,pcVar12,pcVar12 + sVar13);
                      }
                      else {
                        bVar4 = cmGeneratorTarget::IsLinkInterfaceDependentNumberMaxProperty
                                          (local_268,&local_240,psVar10);
                        if (!bVar4) {
                          (__return_storage_ptr__->_M_dataplus)._M_p =
                               (pointer)&__return_storage_ptr__->field_2;
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_260._M_dataplus._M_p == &local_260.field_2) {
                            (__return_storage_ptr__->field_2)._M_allocated_capacity =
                                 CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                                          local_260.field_2._M_local_buf[0]);
                            *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) =
                                 local_260.field_2._8_8_;
                          }
                          else {
                            (__return_storage_ptr__->_M_dataplus)._M_p = local_260._M_dataplus._M_p;
                            (__return_storage_ptr__->field_2)._M_allocated_capacity =
                                 CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                                          local_260.field_2._M_local_buf[0]);
                          }
                          __return_storage_ptr__->_M_string_length = local_260._M_string_length;
                          goto LAB_003243c8;
                        }
                        context->HadContextSensitiveCondition = true;
                        pcVar15 = cmGeneratorTarget::GetLinkInterfaceDependentNumberMaxProperty
                                            (local_268,&local_240,psVar10);
                        pcVar12 = "";
                        if (pcVar15 != (char *)0x0) {
                          pcVar12 = pcVar15;
                        }
                        (__return_storage_ptr__->_M_dataplus)._M_p =
                             (pointer)&__return_storage_ptr__->field_2;
                        sVar13 = strlen(pcVar12);
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)__return_storage_ptr__,pcVar12,pcVar12 + sVar13);
                      }
                    }
                  }
                }
              }
              else {
                bVar4 = cmGeneratorTarget::IsImported(local_268);
                if ((local_220 == (cmGeneratorExpressionDAGChecker *)0x0 || bVar4) ||
                   (bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
                                      (local_220,(cmGeneratorTarget *)0x0), bVar4)) {
LAB_003241eb:
                  if (local_218._M_string_length == 0) {
                    (__return_storage_ptr__->_M_dataplus)._M_p =
                         (pointer)&__return_storage_ptr__->field_2;
                    sVar13 = strlen(pcVar12);
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)__return_storage_ptr__,pcVar12,pcVar12 + sVar13);
                  }
                  else {
                    paVar1 = &local_1f8.field_2;
                    local_1f8._M_dataplus._M_p = (pointer)paVar1;
                    sVar13 = strlen(pcVar12);
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_1f8,pcVar12,pcVar12 + sVar13);
                    cmGeneratorExpressionNode::EvaluateDependentExpression
                              (__return_storage_ptr__,&local_1f8,context->LG,context,pcVar9,
                               local_268,(cmGeneratorExpressionDAGChecker *)local_1a8);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1f8._M_dataplus._M_p != paVar1) {
                      operator_delete(local_1f8._M_dataplus._M_p,
                                      local_1f8.field_2._M_allocated_capacity + 1);
                    }
                    if (local_260._M_string_length != 0) {
                      pcVar12 = ";";
                      if (__return_storage_ptr__->_M_string_length == 0) {
                        pcVar12 = "";
                      }
                      std::operator+(&local_1f8,pcVar12,&local_260);
                      std::__cxx11::string::_M_append
                                ((char *)__return_storage_ptr__,(ulong)local_1f8._M_dataplus._M_p);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1f8._M_dataplus._M_p != paVar1) {
                        operator_delete(local_1f8._M_dataplus._M_p,
                                        local_1f8.field_2._M_allocated_capacity + 1);
                      }
                    }
                  }
                }
                else {
                  psVar10 = &context->Config;
                  bVar4 = cmGeneratorTarget::IsLinkInterfaceDependentNumberMinProperty
                                    (local_268,&local_240,psVar10);
                  if (bVar4) {
                    context->HadContextSensitiveCondition = true;
                    pcVar15 = cmGeneratorTarget::GetLinkInterfaceDependentNumberMinProperty
                                        (local_268,&local_240,psVar10);
                    pcVar12 = "";
                    if (pcVar15 != (char *)0x0) {
                      pcVar12 = pcVar15;
                    }
                    (__return_storage_ptr__->_M_dataplus)._M_p =
                         (pointer)&__return_storage_ptr__->field_2;
                    sVar13 = strlen(pcVar12);
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)__return_storage_ptr__,pcVar12,pcVar12 + sVar13);
                  }
                  else {
                    bVar4 = cmGeneratorTarget::IsLinkInterfaceDependentNumberMaxProperty
                                      (local_268,&local_240,psVar10);
                    if (!bVar4) goto LAB_003241eb;
                    context->HadContextSensitiveCondition = true;
                    pcVar15 = cmGeneratorTarget::GetLinkInterfaceDependentNumberMaxProperty
                                        (local_268,&local_240,psVar10);
                    pcVar12 = "";
                    if (pcVar15 != (char *)0x0) {
                      pcVar12 = pcVar15;
                    }
                    (__return_storage_ptr__->_M_dataplus)._M_p =
                         (pointer)&__return_storage_ptr__->field_2;
                    sVar13 = strlen(pcVar12);
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)__return_storage_ptr__,pcVar12,pcVar12 + sVar13);
                  }
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_218._M_dataplus._M_p != &local_218.field_2) {
                operator_delete(local_218._M_dataplus._M_p,
                                CONCAT71(local_218.field_2._M_allocated_capacity._1_7_,
                                         local_218.field_2._M_local_buf[0]) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_260._M_dataplus._M_p != &local_260.field_2) {
                operator_delete(local_260._M_dataplus._M_p,
                                CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                                         local_260.field_2._M_local_buf[0]) + 1);
              }
            }
            else {
              bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
                                (local_220,(cmGeneratorTarget *)0x0);
              if (!bVar4) {
                bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingIncludeDirectories(local_220);
                if ((((!bVar4) &&
                     (bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingSystemIncludeDirectories
                                        (local_220), !bVar4)) &&
                    ((bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingCompileDefinitions
                                        (local_220), !bVar4 &&
                     ((bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingCompileOptions(local_220),
                      !bVar4 && (bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingAutoUicOptions
                                                   (local_220), !bVar4)))))) &&
                   ((bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingSources(local_220), !bVar4
                    && ((((bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingCompileFeatures
                                             (local_220), !bVar4 &&
                          (bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingLinkOptions(local_220)
                          , !bVar4)) &&
                         (bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingLinkDirectories
                                            (local_220), !bVar4)) &&
                        (bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingLinkDepends(local_220),
                        !bVar4)))))) {
                  __assert_fail("CM_FOR_EACH_TRANSITIVE_PROPERTY_METHOD( ASSERT_TRANSITIVE_PROPERTY_METHOD) false"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmGeneratorExpressionNode.cxx"
                                ,0x556,
                                "virtual std::string TargetPropertyNode::Evaluate(const std::vector<std::string> &, cmGeneratorExpressionContext *, const GeneratorExpressionContent *, cmGeneratorExpressionDAGChecker *) const"
                               );
                }
                goto LAB_00323a0f;
              }
              iVar5 = std::__cxx11::string::compare((char *)&local_240);
              if ((((iVar5 == 0) ||
                   (iVar5 = std::__cxx11::string::compare((char *)&local_240), iVar5 == 0)) ||
                  (((iVar5 = std::__cxx11::string::compare((char *)&local_240), iVar5 == 0 ||
                    ((iVar5 = std::__cxx11::string::compare((char *)&local_240), iVar5 == 0 ||
                     (iVar5 = std::__cxx11::string::compare((char *)&local_240), iVar5 == 0)))) ||
                   (iVar5 = std::__cxx11::string::compare((char *)&local_240), iVar5 == 0)))) ||
                 ((((((iVar5 = std::__cxx11::string::compare((char *)&local_240), iVar5 == 0 ||
                      (iVar5 = std::__cxx11::string::compare((char *)&local_240), iVar5 == 0)) ||
                     (iVar5 = std::__cxx11::string::compare((char *)&local_240), iVar5 == 0)) ||
                    (((iVar5 = std::__cxx11::string::compare((char *)&local_240), iVar5 == 0 ||
                      (iVar5 = std::__cxx11::string::compare((char *)&local_240), iVar5 == 0)) ||
                     ((iVar5 = std::__cxx11::string::compare((char *)&local_240), iVar5 == 0 ||
                      ((iVar5 = std::__cxx11::string::compare((char *)&local_240), iVar5 == 0 ||
                       (iVar5 = std::__cxx11::string::compare((char *)&local_240), iVar5 == 0)))))))
                    ) || (iVar5 = std::__cxx11::string::compare((char *)&local_240), iVar5 == 0)) ||
                  ((((iVar5 = std::__cxx11::string::compare((char *)&local_240), iVar5 == 0 ||
                     (iVar5 = std::__cxx11::string::compare((char *)&local_240), iVar5 == 0)) ||
                    (iVar5 = std::__cxx11::string::compare((char *)&local_240), iVar5 == 0)) ||
                   ((iVar5 = std::__cxx11::string::compare((char *)&local_240), iVar5 == 0 ||
                    (iVar5 = std::__cxx11::string::compare((char *)&local_240), iVar5 == 0)))))))) {
                GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_260,content);
                local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_218,
                           "$<TARGET_PROPERTY:...> expression in link libraries evaluation depends on target property which is transitive over the link libraries, creating a recursion."
                           ,"");
                reportError(context,&local_260,&local_218);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_218._M_dataplus._M_p != &local_218.field_2) {
                  operator_delete(local_218._M_dataplus._M_p,
                                  CONCAT71(local_218.field_2._M_allocated_capacity._1_7_,
                                           local_218.field_2._M_local_buf[0]) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_260._M_dataplus._M_p != &local_260.field_2) goto LAB_00323cbf;
                goto LAB_00323ccc;
              }
              if (pcVar12 != (char *)0x0) goto LAB_00323a0f;
LAB_00323f16:
              (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2
              ;
              __return_storage_ptr__->_M_string_length = 0;
              (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
            }
          }
          if (local_138._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_138._M_pi);
          }
          std::
          _Rb_tree<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::~_Rb_tree(&local_178);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._16_8_ == &local_188) goto LAB_0032321f;
          goto LAB_00324452;
        }
        TVar8 = cmGeneratorTarget::GetType(local_268);
        if (((dagCheckerParent == (cmGeneratorExpressionDAGChecker *)0x0) ||
            (TVar8 != STATIC_LIBRARY)) ||
           ((bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
                               (dagCheckerParent,(cmGeneratorTarget *)0x0), !bVar4 &&
            (bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingSources(dagCheckerParent), !bVar4)))
           ) {
          cmGeneratorTarget::GetLinkerLanguage(__return_storage_ptr__,local_268,&context->Config);
          goto LAB_0032321f;
        }
        GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)local_1a8,content);
        local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_260,
                   "LINKER_LANGUAGE target property can not be used while evaluating link libraries for a static library"
                   ,"");
        reportError(context,(string *)local_1a8,&local_260);
      }
      else {
        GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)local_1a8,content);
        local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_260,"Property name not supported.","");
        reportError(context,(string *)local_1a8,&local_260);
      }
    }
LAB_003231cf:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,
                      CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                               local_260.field_2._M_local_buf[0]) + 1);
    }
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
LAB_0032321f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* dagCheckerParent) const override
  {
    if (parameters.size() != 1 && parameters.size() != 2) {
      reportError(
        context, content->GetOriginalExpression(),
        "$<TARGET_PROPERTY:...> expression requires one or two parameters");
      return std::string();
    }
    static cmsys::RegularExpression propertyNameValidator("^[A-Za-z0-9_]+$");

    cmGeneratorTarget const* target = context->HeadTarget;
    std::string propertyName = parameters.front();

    if (parameters.size() == 1) {
      context->HadHeadSensitiveCondition = true;
    }
    if (!target && parameters.size() == 1) {
      reportError(
        context, content->GetOriginalExpression(),
        "$<TARGET_PROPERTY:prop>  may only be used with binary targets.  "
        "It may not be used with add_custom_command or add_custom_target.  "
        "Specify the target to read a property from using the "
        "$<TARGET_PROPERTY:tgt,prop> signature instead.");
      return std::string();
    }

    if (parameters.size() == 2) {
      if (parameters.front().empty() && parameters[1].empty()) {
        reportError(
          context, content->GetOriginalExpression(),
          "$<TARGET_PROPERTY:tgt,prop> expression requires a non-empty "
          "target name and property name.");
        return std::string();
      }
      if (parameters.front().empty()) {
        reportError(
          context, content->GetOriginalExpression(),
          "$<TARGET_PROPERTY:tgt,prop> expression requires a non-empty "
          "target name.");
        return std::string();
      }

      std::string targetName = parameters.front();
      propertyName = parameters[1];
      if (!cmGeneratorExpression::IsValidTargetName(targetName)) {
        if (!propertyNameValidator.find(propertyName)) {
          ::reportError(context, content->GetOriginalExpression(),
                        "Target name and property name not supported.");
          return std::string();
        }
        ::reportError(context, content->GetOriginalExpression(),
                      "Target name not supported.");
        return std::string();
      }
      static const std::string propALIASED_TARGET = "ALIASED_TARGET";
      if (propertyName == propALIASED_TARGET) {
        if (context->LG->GetMakefile()->IsAlias(targetName)) {
          if (cmGeneratorTarget* tgt =
                context->LG->FindGeneratorTargetToUse(targetName)) {
            return tgt->GetName();
          }
        }
        return "";
      }
      target = context->LG->FindGeneratorTargetToUse(targetName);

      if (!target) {
        std::ostringstream e;
        e << "Target \"" << targetName << "\" not found.";
        reportError(context, content->GetOriginalExpression(), e.str());
        return std::string();
      }
      context->AllTargets.insert(target);
    }

    if (target == context->HeadTarget) {
      // Keep track of the properties seen while processing.
      // The evaluation of the LINK_LIBRARIES generator expressions
      // will check this to ensure that properties have one consistent
      // value for all evaluations.
      context->SeenTargetProperties.insert(propertyName);
    }
    if (propertyName == "SOURCES") {
      context->SourceSensitiveTargets.insert(target);
    }

    if (propertyName.empty()) {
      reportError(
        context, content->GetOriginalExpression(),
        "$<TARGET_PROPERTY:...> expression requires a non-empty property "
        "name.");
      return std::string();
    }

    if (!propertyNameValidator.find(propertyName)) {
      ::reportError(context, content->GetOriginalExpression(),
                    "Property name not supported.");
      return std::string();
    }

    assert(target);

    if (propertyName == "LINKER_LANGUAGE") {
      if (target->LinkLanguagePropagatesToDependents() && dagCheckerParent &&
          (dagCheckerParent->EvaluatingLinkLibraries() ||
           dagCheckerParent->EvaluatingSources())) {
        reportError(
          context, content->GetOriginalExpression(),
          "LINKER_LANGUAGE target property can not be used while evaluating "
          "link libraries for a static library");
        return std::string();
      }
      return target->GetLinkerLanguage(context->Config);
    }

    cmGeneratorExpressionDAGChecker dagChecker(
      context->Backtrace, target, propertyName, content, dagCheckerParent);

    switch (dagChecker.Check()) {
      case cmGeneratorExpressionDAGChecker::SELF_REFERENCE:
        dagChecker.ReportError(context, content->GetOriginalExpression());
        return std::string();
      case cmGeneratorExpressionDAGChecker::CYCLIC_REFERENCE:
        // No error. We just skip cyclic references.
        return std::string();
      case cmGeneratorExpressionDAGChecker::ALREADY_SEEN:
        for (size_t i = 1; i < cm::size(targetPropertyTransitiveWhitelist);
             ++i) {
          if (targetPropertyTransitiveWhitelist[i] == propertyName) {
            // No error. We're not going to find anything new here.
            return std::string();
          }
        }
      case cmGeneratorExpressionDAGChecker::DAG:
        break;
    }

    const char* prop = target->GetProperty(propertyName);

    if (dagCheckerParent) {
      if (dagCheckerParent->EvaluatingGenexExpression() ||
          dagCheckerParent->EvaluatingPICExpression()) {
        // No check required.
      } else if (dagCheckerParent->EvaluatingLinkLibraries()) {
#define TRANSITIVE_PROPERTY_COMPARE(PROPERTY)                                 \
  (#PROPERTY == propertyName || "INTERFACE_" #PROPERTY == propertyName) ||
        if (CM_FOR_EACH_TRANSITIVE_PROPERTY_NAME(
              TRANSITIVE_PROPERTY_COMPARE) false) { // NOLINT(*)
          reportError(
            context, content->GetOriginalExpression(),
            "$<TARGET_PROPERTY:...> expression in link libraries "
            "evaluation depends on target property which is transitive "
            "over the link libraries, creating a recursion.");
          return std::string();
        }
#undef TRANSITIVE_PROPERTY_COMPARE

        if (!prop) {
          return std::string();
        }
      } else {
#define ASSERT_TRANSITIVE_PROPERTY_METHOD(METHOD) dagCheckerParent->METHOD() ||

        assert(CM_FOR_EACH_TRANSITIVE_PROPERTY_METHOD(
          ASSERT_TRANSITIVE_PROPERTY_METHOD) false); // NOLINT(clang-tidy)
#undef ASSERT_TRANSITIVE_PROPERTY_METHOD
      }
    }

    std::string linkedTargetsContent;

    std::string interfacePropertyName;
    bool isInterfaceProperty = false;

#define POPULATE_INTERFACE_PROPERTY_NAME(prop)                                \
  if (propertyName == #prop) {                                                \
    interfacePropertyName = "INTERFACE_" #prop;                               \
  } else if (propertyName == "INTERFACE_" #prop) {                            \
    interfacePropertyName = "INTERFACE_" #prop;                               \
    isInterfaceProperty = true;                                               \
  } else

    CM_FOR_EACH_TRANSITIVE_PROPERTY_NAME(POPULATE_INTERFACE_PROPERTY_NAME)
    // Note that the above macro terminates with an else
    /* else */ if (cmHasLiteralPrefix(propertyName, "COMPILE_DEFINITIONS_")) {
      cmPolicies::PolicyStatus polSt =
        context->LG->GetPolicyStatus(cmPolicies::CMP0043);
      if (polSt == cmPolicies::WARN || polSt == cmPolicies::OLD) {
        interfacePropertyName = "INTERFACE_COMPILE_DEFINITIONS";
      }
    }
#undef POPULATE_INTERFACE_PROPERTY_NAME
    cmGeneratorTarget const* headTarget =
      context->HeadTarget && isInterfaceProperty ? context->HeadTarget
                                                 : target;

    if (isInterfaceProperty) {
      if (cmLinkInterfaceLibraries const* iface =
            target->GetLinkInterfaceLibraries(context->Config, headTarget,
                                              true)) {
        linkedTargetsContent =
          getLinkedTargetsContent(iface->Libraries, target, headTarget,
                                  context, &dagChecker, interfacePropertyName);
      }
    } else if (!interfacePropertyName.empty()) {
      if (cmLinkImplementationLibraries const* impl =
            target->GetLinkImplementationLibraries(context->Config)) {
        linkedTargetsContent =
          getLinkedTargetsContent(impl->Libraries, target, target, context,
                                  &dagChecker, interfacePropertyName);
      }
    }

    if (!prop) {
      if (target->IsImported() ||
          target->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
        return linkedTargetsContent;
      }
      if (target->IsLinkInterfaceDependentBoolProperty(propertyName,
                                                       context->Config)) {
        context->HadContextSensitiveCondition = true;
        return target->GetLinkInterfaceDependentBoolProperty(propertyName,
                                                             context->Config)
          ? "1"
          : "0";
      }
      if (target->IsLinkInterfaceDependentStringProperty(propertyName,
                                                         context->Config)) {
        context->HadContextSensitiveCondition = true;
        const char* propContent =
          target->GetLinkInterfaceDependentStringProperty(propertyName,
                                                          context->Config);
        return propContent ? propContent : "";
      }
      if (target->IsLinkInterfaceDependentNumberMinProperty(propertyName,
                                                            context->Config)) {
        context->HadContextSensitiveCondition = true;
        const char* propContent =
          target->GetLinkInterfaceDependentNumberMinProperty(propertyName,
                                                             context->Config);
        return propContent ? propContent : "";
      }
      if (target->IsLinkInterfaceDependentNumberMaxProperty(propertyName,
                                                            context->Config)) {
        context->HadContextSensitiveCondition = true;
        const char* propContent =
          target->GetLinkInterfaceDependentNumberMaxProperty(propertyName,
                                                             context->Config);
        return propContent ? propContent : "";
      }

      return linkedTargetsContent;
    }

    if (!target->IsImported() && dagCheckerParent &&
        !dagCheckerParent->EvaluatingLinkLibraries()) {
      if (target->IsLinkInterfaceDependentNumberMinProperty(propertyName,
                                                            context->Config)) {
        context->HadContextSensitiveCondition = true;
        const char* propContent =
          target->GetLinkInterfaceDependentNumberMinProperty(propertyName,
                                                             context->Config);
        return propContent ? propContent : "";
      }
      if (target->IsLinkInterfaceDependentNumberMaxProperty(propertyName,
                                                            context->Config)) {
        context->HadContextSensitiveCondition = true;
        const char* propContent =
          target->GetLinkInterfaceDependentNumberMaxProperty(propertyName,
                                                             context->Config);
        return propContent ? propContent : "";
      }
    }
    if (!interfacePropertyName.empty()) {
      std::string result = this->EvaluateDependentExpression(
        prop, context->LG, context, headTarget, target, &dagChecker);
      if (!linkedTargetsContent.empty()) {
        result += (result.empty() ? "" : ";") + linkedTargetsContent;
      }
      return result;
    }
    return prop;
  }